

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationTanh * __thiscall
CoreML::Specification::ActivationParams::mutable_tanh(ActivationParams *this)

{
  bool bVar1;
  ActivationTanh *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_tanh(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_tanh(this);
    this_00 = (ActivationTanh *)operator_new(0x18);
    ActivationTanh::ActivationTanh(this_00);
    (this->NonlinearityType_).tanh_ = this_00;
  }
  return (ActivationTanh *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationTanh* ActivationParams::mutable_tanh() {
  if (!has_tanh()) {
    clear_NonlinearityType();
    set_has_tanh();
    NonlinearityType_.tanh_ = new ::CoreML::Specification::ActivationTanh;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.tanh)
  return NonlinearityType_.tanh_;
}